

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O1

void __thiscall OpenMD::RestReader::readFrameProperties(RestReader *this,istream *inputStream)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  long *plVar4;
  string line;
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  __s = this->buffer;
  std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
  std::istream::getline((char *)inputStream,(long)__s,'\0');
  local_50 = local_40;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,this->buffer + sVar2);
  lVar3 = std::__cxx11::string::find((char *)&local_50,0x294248,0);
  if (lVar3 == -1) {
    builtin_strncpy(painCave.errMsg,"RestReader Error: Missing <FrameData>\n",0x27);
    painCave.isFatal = 1;
    simError();
  }
  do {
    std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
    plVar4 = (long *)std::istream::getline((char *)inputStream,(long)__s,'\0');
    pcVar1 = local_48;
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar1,(ulong)__s);
    lVar3 = std::__cxx11::string::find((char *)&local_50,0x29427b,0);
  } while (lVar3 == -1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void RestReader::readFrameProperties(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<FrameData>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Missing <FrameData>\n");
      painCave.isFatal = 1;
      simError();
    }

    // restraints don't care about frame data (unless we need to wrap
    // coordinates, but we'll worry about that later), so
    // we'll just scan ahead until the end of the frame data:

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</FrameData>") != std::string::npos) { break; }
    }
  }